

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::ThreadData::try_consume_one(ThreadData *this)

{
  int64_t iVar1;
  anon_class_8_1_8991fb9c consume_func;
  anon_class_8_1_8991fb9c local_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_30.this = (ThreadData *)this;
  if (((byte)this[0x10] & 2) == 0) {
    try_consume_one::anon_class_8_1_8991fb9c::operator()(&local_30);
  }
  else {
    local_28._8_8_ = 0;
    pcStack_10 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h:554:37)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h:554:37)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)this;
    iVar1 = run_exception_test((function<void_()> *)&local_28);
    *(long *)(this + 0x40) = *(long *)(this + 0x40) + iVar1;
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return;
}

Assistant:

void try_consume_one()
            {
                auto consume_func = [&] {
                    if (m_random.get_bool())
                    {
                        if (auto consume = m_queue.try_start_consume())
                        {
                            // find the type to get the index
                            auto const type    = consume.complete_type();
                            auto const type_it = m_parent_tester.m_element_types.find(type);
                            DENSITY_TEST_ASSERT(type_it != m_parent_tester.m_element_types.end());

                            // call the user-provided callback
                            auto const type_index = type_it->second;
                            (*m_parent_tester.m_consume_cases[type_index])(consume);

                            // in case of exception the element is not consumed (because we don't call commit)
                            exception_checkpoint();

                            // done! From now on no exception can occur
                            consume.commit();
                            m_final_stats.m_counters[type_index].m_existing--;
                            m_consumes_committed++;
                        }
                    }
                    else
                    {
                        if (auto consume = m_queue.try_start_reentrant_consume())
                        {
                            // find the type to get the index
                            auto const type    = consume.complete_type();
                            auto const type_it = m_parent_tester.m_element_types.find(type);
                            DENSITY_TEST_ASSERT(type_it != m_parent_tester.m_element_types.end());

                            // call the user-provided callback
                            auto const type_index = type_it->second;
                            (*m_parent_tester.m_reentrant_consume_cases[type_index])(consume);

                            // in case of exception the element is not consumed (because we don't call commit)
                            exception_checkpoint();

                            m_pending_reentrant_consumes.push_back(
                              ReentrantConsume(type_index, std::move(consume)));
                        }
                    }
                };

                if (
                  (m_flags & QueueTesterFlags::eTestExceptions) ==
                  QueueTesterFlags::eTestExceptions)
                {
                    m_final_stats.m_exceptions_during_consumes += run_exception_test(consume_func);
                }
                else
                {
                    consume_func();
                }
            }